

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O2

Value<char16_t> * __thiscall Qentem::Value<char16_t>::operator=(Value<char16_t> *this,char16_t *str)

{
  String<char16_t> local_28;
  
  reset(this);
  String<char16_t>::String(&local_28,str);
  String<char16_t>::operator=((String<char16_t> *)this,&local_28);
  Memory::Deallocate(local_28.storage_);
  this->type_ = String;
  return this;
}

Assistant:

Value &operator=(const Char_T *str) {
        reset();
        string_ = StringT{str};
        setTypeToString();

        return *this;
    }